

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::operator[](Path *__return_storage_ptr__,Path *this,size_t index)

{
  char *pcVar1;
  out_of_range *this_00;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  size_t local_70;
  size_t i;
  size_t lastpos;
  size_t pos;
  allocator local_41;
  string local_40 [32];
  size_t local_20;
  size_t index_local;
  Path *this_local;
  
  local_20 = index;
  index_local = (size_t)this;
  this_local = __return_storage_ptr__;
  if ((index == 0) &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar1 == '/')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"/",&local_41);
    Path(__return_storage_ptr__,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    return __return_storage_ptr__;
  }
  lastpos = 0;
  i = 0;
  local_70 = 0;
  while( true ) {
    lastpos = std::__cxx11::string::find((char *)this,0x11817c);
    if (lastpos == 0xffffffffffffffff) {
      if (local_20 == local_70) {
        std::__cxx11::string::substr((ulong)local_b0,(ulong)this);
        Path(__return_storage_ptr__,local_b0);
        std::__cxx11::string::~string((string *)local_b0);
        return __return_storage_ptr__;
      }
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"Index out of path range",&local_d1);
      std::out_of_range::out_of_range(this_00,local_d0);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (local_70 == local_20) break;
    i = lastpos + 1;
    lastpos = lastpos + 1;
    local_70 = local_70 + 1;
  }
  std::__cxx11::string::substr((ulong)local_90,(ulong)this);
  Path(__return_storage_ptr__,local_90);
  std::__cxx11::string::~string((string *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Path Path::operator[](size_t index) const
{
  // Absolute path index 0 needs special treatment
  if (index == 0 && m_path[0] == '/')
    return Path("/");

  size_t pos     = 0;
  size_t lastpos = 0;
  size_t i       = 0;
  while ((pos = m_path.find("/", pos)) != string::npos) { // Assignment intended
    if (i == index)
      return Path(m_path.substr(lastpos, pos - lastpos));

    lastpos = pos + 1;
    pos++;
    i++;
  }

  // Last element requested
  if (index == i)
    return Path(m_path.substr(lastpos));

  // Out of range
  throw(std::out_of_range("Index out of path range"));
}